

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdGetConfidentialTxInIndex
              (void *handle,char *tx_hex_string,char *txid,uint32_t vout,uint32_t *index)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *pCVar3;
  OutPoint outpoint;
  ConfidentialTransactionContext tx;
  allocator local_151;
  OutPoint local_150;
  Txid local_128;
  string local_108;
  ConfidentialTransactionContext local_e8;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5f3c92;
    local_e8.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x367
    ;
    local_e8.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x5f3f91;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&local_e8.super_ConfidentialTransaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_e8);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_150,tx_hex_string,(allocator *)&local_128);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              (&local_e8,(string *)&local_150);
    if (local_150.txid_._vptr_Txid !=
        (_func_int **)
        ((long)&local_150.txid_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8U)) {
      operator_delete(local_150.txid_._vptr_Txid);
    }
    std::__cxx11::string::string((string *)&local_108,txid,&local_151);
    cfd::core::Txid::Txid(&local_128,&local_108);
    cfd::core::OutPoint::OutPoint(&local_150,&local_128,vout);
    local_128._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
    if (local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_128.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if (index != (uint32_t *)0x0) {
      uVar2 = cfd::ConfidentialTransactionContext::GetTxInIndex(&local_e8,&local_150);
      *index = uVar2;
    }
    local_150.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
    if (local_150.txid_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.txid_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_e8);
    return 0;
  }
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)0x5f3c92;
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x36d;
  local_e8.super_ConfidentialTransaction.vin_.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x5f3f91;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,"txid is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&local_e8.super_ConfidentialTransaction.vin_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"Failed to parameter. txid is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&local_e8);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxInIndex(
    void* handle, const char* tx_hex_string, const char* txid, uint32_t vout,
    uint32_t* index) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    ConfidentialTransactionContext tx(tx_hex_string);
    OutPoint outpoint(Txid(txid), vout);
    if (index != nullptr) {
      *index = tx.GetTxInIndex(outpoint);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}